

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlUCSIsEnclosedAlphanumerics(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  PyObject *pPVar2;
  int code;
  undefined4 local_14;
  
  local_14 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = libxml_deprecationWarning("xmlUCSIsEnclosedAlphanumerics");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"i:xmlUCSIsEnclosedAlphanumerics",&local_14);
    if (iVar1 != 0) {
      iVar1 = xmlUCSIsEnclosedAlphanumerics(local_14);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlUCSIsEnclosedAlphanumerics(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int code;

    if (libxml_deprecationWarning("xmlUCSIsEnclosedAlphanumerics") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"i:xmlUCSIsEnclosedAlphanumerics", &code))
        return(NULL);

    c_retval = xmlUCSIsEnclosedAlphanumerics(code);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}